

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::new_line
          (basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this,
          size_t len)

{
  string_type *psVar1;
  size_t sVar2;
  bool bVar3;
  string asStack_68 [8];
  size_t local_60;
  char *local_48 [4];
  
  psVar1 = &(this->options_).new_line_chars_;
  std::__cxx11::string::string((string *)local_48,(string *)psVar1);
  std::__cxx11::string::string(asStack_68,(string *)psVar1);
  stream_sink<char>::append(&this->sink_,local_48[0],local_60);
  std::__cxx11::string::~string(asStack_68);
  std::__cxx11::string::~string((string *)local_48);
  sVar2 = len;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    stream_sink<char>::push_back(&this->sink_,' ');
  }
  this->column_ = len;
  return;
}

Assistant:

void new_line(std::size_t len)
        {
            sink_.append(options_.new_line_chars().data(),options_.new_line_chars().length());
            for (std::size_t i = 0; i < len; ++i)
            {
                sink_.push_back(' ');
            }
            column_ = len;
        }